

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo_KEM.h
# Opt level: O2

void Hacl_Impl_Frodo_Params_frodo_gen_matrix
               (Spec_Frodo_Params_frodo_gen_a a,uint32_t n,uint8_t *seed,uint16_t *a_matrix)

{
  short sVar1;
  long lVar2;
  long lVar3;
  uint8_t *tmp_seed0;
  uint8_t *r3;
  undefined4 in_register_00000034;
  undefined7 in_register_00000039;
  undefined8 *puVar4;
  long lVar5;
  short local_288;
  undefined8 local_286;
  undefined8 uStack_27e;
  short local_276;
  undefined8 local_274;
  undefined8 uStack_26c;
  short local_264;
  undefined8 local_262;
  undefined8 uStack_25a;
  short local_252;
  undefined8 local_250;
  undefined8 uStack_248;
  uint8_t local_238 [128];
  uint8_t local_1b8 [128];
  uint8_t local_138 [128];
  uint8_t local_b8 [128];
  undefined2 auStack_38 [4];
  
  puVar4 = (undefined8 *)CONCAT71(in_register_00000039,a);
  memset(local_238,0,0x200);
  local_286 = *puVar4;
  uStack_27e = puVar4[1];
  local_274 = *puVar4;
  uStack_26c = puVar4[1];
  local_262 = *puVar4;
  uStack_25a = puVar4[1];
  local_250 = *puVar4;
  uStack_248 = puVar4[1];
  memset((void *)CONCAT44(in_register_00000034,n),0,0x2000);
  lVar3 = (long)CONCAT44(in_register_00000034,n) + 0x180;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    sVar1 = (short)lVar5;
    local_288 = sVar1 * 4;
    local_276 = sVar1 * 4 + 1;
    local_264 = sVar1 * 4 + 2;
    local_252 = sVar1 * 4 + 3;
    Hacl_Hash_SHA3_shake128(local_238,0x80,(uint8_t *)&local_288,0x12);
    Hacl_Hash_SHA3_shake128(local_1b8,0x80,(uint8_t *)&local_276,0x12);
    Hacl_Hash_SHA3_shake128(local_138,0x80,(uint8_t *)&local_264,0x12);
    Hacl_Hash_SHA3_shake128(local_b8,0x80,(uint8_t *)&local_252,0x12);
    for (lVar2 = -0x40; lVar2 != 0; lVar2 = lVar2 + 1) {
      *(undefined2 *)(lVar3 + -0x100 + lVar2 * 2) = *(undefined2 *)(local_1b8 + lVar2 * 2);
      *(undefined2 *)(lVar3 + -0x80 + lVar2 * 2) = *(undefined2 *)(local_138 + lVar2 * 2);
      *(undefined2 *)(lVar3 + lVar2 * 2) = *(undefined2 *)(local_b8 + lVar2 * 2);
      *(undefined2 *)(lVar3 + 0x80 + lVar2 * 2) = auStack_38[lVar2];
    }
    lVar3 = lVar3 + 0x200;
  }
  return;
}

Assistant:

static inline void
Hacl_Impl_Frodo_Params_frodo_gen_matrix(
  Spec_Frodo_Params_frodo_gen_a a,
  uint32_t n,
  uint8_t *seed,
  uint16_t *a_matrix
)
{
  switch (a)
  {
    case Spec_Frodo_Params_SHAKE128:
      {
        Hacl_Impl_Frodo_Gen_frodo_gen_matrix_shake_4x(n, seed, a_matrix);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}